

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

ObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ohI)

{
  bool bVar1;
  undefined8 uVar2;
  E *this_00;
  E *pEVar3;
  char *arg;
  const_reference this_01;
  char *pcVar4;
  const_reference ppOVar5;
  ostream *poVar6;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  ObservationHistoryTree *oht;
  size_t nrOH;
  size_t nrA;
  char *in_stack_ffffffffffffff98;
  ENotCached *in_stack_ffffffffffffffa0;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeIndividualObservationHistories
                    ((PlanningUnitMADPDiscreteParameters *)((long)in_RDI + 0x39));
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    ENotCached::ENotCached(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar2,&ENotCached::typeinfo,ENotCached::~ENotCached);
  }
  this_00 = (E *)(**(code **)(*in_RDI + 0x30))();
  pEVar3 = (E *)std::
                vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                ::size((vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                        *)(in_RDI + 0x3c));
  if (pEVar3 != this_00) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(this_00,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  if ((E *)(ulong)in_ESI < this_00) {
    arg = (char *)GetNrObservationHistories
                            (in_stack_ffffffffffffffc0,(Index)((ulong)in_RDI >> 0x20));
    this_01 = std::
              vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
              ::operator[]((vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                            *)(in_RDI + 0x3c),(ulong)in_ESI);
    pcVar4 = (char *)std::
                     vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::
                     size(this_01);
    if (pcVar4 != arg) {
      uVar2 = __cxa_allocate_exception(0x28);
      E::E(this_00,arg);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    if ((char *)(ulong)in_EDX < arg) {
      std::
      vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
      ::at((vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
            *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      ppOVar5 = std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::at
                          ((vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                            *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      return *ppOVar5;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index a) index ohI out of bounds"
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index ohI) index agentI out of bounds"
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return (ObservationHistoryTree *)0x0;
}

Assistant:

ObservationHistoryTree* PlanningUnitMADPDiscrete::GetObservationHistoryTree(Index agentI, Index ohI) const
{
    if(!_m_params.GetComputeIndividualObservationHistories())
        throw ENotCached("PlanningUnitMADPDiscrete::GetObservationHistoryTree IndividualObservationHistories are not cached!");

    size_t nrA = GetNrAgents();
    if(_m_observationHistoryTreeVectors.size() != nrA)
        throw E("_m_observationHistoryTreeVectors.size() != nrA)");

    if(agentI < nrA )
    {
    size_t nrOH = GetNrObservationHistories(agentI);
if(DEBUG_PUD){cout << "_m_observationHistoryTreeVectors["<<agentI<<"].size() = " <<_m_observationHistoryTreeVectors[agentI].size()<<endl;}
    if(_m_observationHistoryTreeVectors[agentI].size() != nrOH)
        throw E("_m_observationHistoryTreeVectors[agentI].size() != nrOH)");

    if(ohI < nrOH )
    {
if(DEBUG_PUD){ cout <<"accessing _m_observationHistoryTreeVectors["<<    agentI<<"]["<<ohI<<"]"<<endl;}

        ObservationHistoryTree* oht = 
            _m_observationHistoryTreeVectors.at(agentI).at(ohI);
if(DEBUG_PUD){ cout <<"...done - returning "<<oht<<endl;}
        return (oht);
    }
    else
        cerr << "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index a) index ohI out of bounds"<<endl;
    }
    else
    cerr << "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index ohI) index agentI out of bounds"<<endl;   
    
    return(0);
   
}